

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<45UL,_GF2::MOLex<45UL>_>::SymDiffSplice
          (MP<45UL,_GF2::MOLex<45UL>_> *this,MP<45UL,_GF2::MOLex<45UL>_> *polyRight)

{
  bool bVar1;
  _List_node_base *in_RSI;
  _List_node_base *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  int cmp;
  iterator iterNext;
  iterator iterRight;
  iterator iter;
  uint in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  MOLex<45UL> *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  bool local_99;
  iterator local_90;
  _List_const_iterator<GF2::MM<45UL>_> local_88;
  _List_const_iterator<GF2::MM<45UL>_> local_80;
  iterator local_78;
  _List_const_iterator<GF2::MM<45UL>_> local_70;
  _Self local_68;
  _List_const_iterator<GF2::MM<45UL>_> local_60;
  _List_node_base *local_58;
  _List_const_iterator<GF2::MM<45UL>_> local_50;
  _List_const_iterator<GF2::MM<45UL>_> local_48;
  int local_3c;
  _Self local_38;
  _Self local_30;
  _List_iterator<GF2::MM<45UL>_> local_28;
  _Self local_20;
  _Self local_18;
  _List_node_base *local_10;
  
  if (in_RDI == in_RSI) {
    SetEmpty((MP<45UL,_GF2::MOLex<45UL>_> *)0x1a1e78);
  }
  else {
    local_10 = in_RSI;
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                   ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                   ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::_List_iterator<GF2::MM<45UL>_>::_List_iterator(&local_28);
    while( true ) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                     ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar1 = std::operator!=(&local_18,&local_30);
      local_99 = false;
      if (bVar1) {
        local_38._M_node =
             (_List_node_base *)
             std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                       ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_99 = std::operator!=(&local_20,&local_38);
      }
      if (local_99 == false) break;
      std::_List_iterator<GF2::MM<45UL>_>::operator*
                ((_List_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff40);
      std::_List_iterator<GF2::MM<45UL>_>::operator*
                ((_List_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffff40);
      local_3c = MOLex<45UL>::Compare
                           (in_stack_ffffffffffffff40,
                            (MM<45UL> *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            (MM<45UL> *)0x1a1f61);
      if (local_3c < 1) {
        if (local_3c < 0) {
          local_28._M_node = local_20._M_node;
          std::_List_iterator<GF2::MM<45UL>_>::operator++(&local_28);
          std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_48,&local_18);
          in_stack_ffffffffffffff48._M_node = local_10;
          std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_50,&local_20);
          std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::splice
                    ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)in_RDI,
                     (int)local_48._M_node,(__off64_t *)in_stack_ffffffffffffff48._M_node,
                     (int)local_50._M_node,in_R8,in_R9,in_stack_ffffffffffffff38);
          local_20._M_node = local_28._M_node;
        }
        else {
          std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_60,&local_18);
          local_58 = (_List_node_base *)
                     std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::erase
                               ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                                in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
          local_18._M_node = local_58;
          std::_List_iterator<GF2::MM<45UL>_>::operator++(&local_20);
        }
      }
      else {
        std::_List_iterator<GF2::MM<45UL>_>::operator++(&local_18);
      }
    }
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                   ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar1 = std::operator==(&local_18,&local_68);
    if (bVar1) {
      local_78._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                     ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_70,&local_78);
      std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_80,&local_20);
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                     ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_88,&local_90);
      std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::splice
                ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)in_RDI,
                 (int)local_70._M_node,(__off64_t *)local_10,(int)local_80._M_node,
                 (__off64_t *)local_88._M_node,in_R9,in_stack_ffffffffffffff38);
    }
  }
  return;
}

Assistant:

void SymDiffSplice(MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin(), iterRight = polyRight.begin(), iterNext;
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// *iter < *iterRight?
				if (cmp < 0)
				{
					// запомнить следующий моном polyRight
					++(iterNext = iterRight);
					// перенести *iterRight перед *iter	
					splice(iter, polyRight, iterRight);
					// перейти к следующему моному polyRight
					iterRight = iterNext;
				}
				// *iter == *iterRight?
				else iter = erase(iter), ++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			splice(end(), polyRight, iterRight, polyRight.end());
	}